

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer_on_shmem.cpp
# Opt level: O0

int64_t __thiscall
SharedMemRingBuffer::WaitFor(SharedMemRingBuffer *this,size_t user_id,int64_t index)

{
  long lVar1;
  long in_RDX;
  long in_RDI;
  int64_t current_cursor;
  memory_order __b;
  long local_20;
  
  lVar1 = *(long *)(in_RDI + 0xd8);
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  local_20 = *(long *)(lVar1 + 0x40);
  if (local_20 < in_RDX) {
    local_20 = (**(code **)(**(long **)(in_RDI + 0x30) + 0x10))(*(long **)(in_RDI + 0x30),in_RDX);
  }
  return local_20;
}

Assistant:

int64_t SharedMemRingBuffer::WaitFor(size_t user_id, int64_t index)
{
    int64_t current_cursor = ring_buffer_status_on_shared_mem_->cursor.load() ;

    if( index > current_cursor ) {
        
#if 0
        char szMsg[100];
        snprintf(szMsg, sizeof(szMsg), 
                "[id:%d]    \t\t\t\t\t\t\t\t\t\t\t\t[%s-%d] index [%" PRId64 " - trans : %" PRId64 "] no data, wait for :current_cursor[%" PRId64 "]", 
                user_id, __func__, __LINE__, index, GetTranslatedIndex(index),current_cursor  );
        {AtomicPrint atomicPrint(szMsg);}
#endif
        //wait strategy
        return wait_strategy_->Wait(index);
    } else {
#if 0
        char szMsg[100];
        snprintf(szMsg, sizeof(szMsg), "[id:%d]    \t\t\t\t\t\t\t\t\t\t\t\t [%s-%d] index[%" PRId64 "] returns [%" PRId64 "] ",
                user_id, __func__, __LINE__, index, ring_buffer_status_on_shared_mem_->cursor.load() );
        {AtomicPrint atomicPrint(szMsg);}
#endif
        return current_cursor ;
    }
    return 0;
}